

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_predictor_8x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i ww [2];
  __m128i wh [4];
  __m128i pixels [4];
  int in_stack_00000370;
  __m128i *in_stack_ffffffffffffff38;
  __m128i *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  longlong local_68 [5];
  ptrdiff_t in_stack_ffffffffffffffc0;
  uint8_t *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  __m128i *in_stack_ffffffffffffffd8;
  
  load_pixel_w8((uint8_t *)in_RDX,(uint8_t *)in_RCX,0x10,(__m128i *)local_68);
  load_weight_w8(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  smooth_pred_8xh(in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_00000370);
  smooth_pred_8xh(in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_00000370);
  return;
}

Assistant:

void aom_smooth_predictor_8x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[4];
  load_pixel_w8(above, left, 16, pixels);

  __m128i wh[4], ww[2];
  load_weight_w8(16, wh, ww);

  smooth_pred_8xh(pixels, wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_8xh(pixels, &wh[2], ww, 8, dst, stride, 1);
}